

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseReference
          (AsciiParser *this,Reference *out,bool *triple_deliminated)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint8_t uVar3;
  StreamReader *pSVar4;
  bool bVar5;
  ostream *poVar6;
  ulong uVar7;
  char nc;
  AssetPath ap;
  ostringstream ss_e;
  char local_209;
  AssetPath local_208;
  string local_1c8;
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  size_type local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  ios_base local_138 [264];
  
  bVar5 = SkipWhitespaceAndNewline(this,true);
  if ((bVar5) && (bVar5 = LookChar1(this,&local_209), bVar5)) {
    if (local_209 == '<') {
      local_208.asset_path_._M_dataplus._M_p = (pointer)&local_208.asset_path_.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"");
      local_1a8._0_8_ = local_1a8 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,local_208.asset_path_._M_dataplus._M_p,
                 local_208.asset_path_._M_dataplus._M_p + local_208.asset_path_._M_string_length);
      local_180 = 0;
      local_178[0]._M_local_buf[0] = '\0';
      local_188._M_p = (pointer)local_178;
      ::std::__cxx11::string::operator=((string *)out,(string *)local_1a8);
      ::std::__cxx11::string::operator=
                ((string *)&(out->asset_path).resolved_path_,(string *)&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_p != local_178) {
        operator_delete(local_188._M_p,
                        CONCAT71(local_178[0]._M_allocated_capacity._1_7_,
                                 local_178[0]._M_local_buf[0]) + 1);
      }
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.asset_path_._M_dataplus._M_p != &local_208.asset_path_.field_2) {
        operator_delete(local_208.asset_path_._M_dataplus._M_p,
                        CONCAT71(local_208.asset_path_.field_2._M_allocated_capacity._1_7_,
                                 local_208.asset_path_.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      paVar1 = &local_208.asset_path_.field_2;
      local_208.asset_path_._M_string_length = 0;
      local_208.asset_path_.field_2._M_local_buf[0] = '\0';
      paVar2 = &local_208.resolved_path_.field_2;
      local_208.resolved_path_._M_string_length = 0;
      local_208.resolved_path_.field_2._M_local_buf[0] = '\0';
      local_208.asset_path_._M_dataplus._M_p = (pointer)paVar1;
      local_208.resolved_path_._M_dataplus._M_p = (pointer)paVar2;
      bVar5 = ParseAssetIdentifier(this,&local_208,triple_deliminated);
      if (bVar5) {
        ::std::__cxx11::string::_M_assign((string *)out);
        ::std::__cxx11::string::_M_assign((string *)&(out->asset_path).resolved_path_);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[ASCII]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"ParseReference",0xe);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x9e9);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Failed to parse asset path identifier.",0x26);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.resolved_path_._M_dataplus._M_p != paVar2) {
        operator_delete(local_208.resolved_path_._M_dataplus._M_p,
                        CONCAT71(local_208.resolved_path_.field_2._M_allocated_capacity._1_7_,
                                 local_208.resolved_path_.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.asset_path_._M_dataplus._M_p != paVar1) {
        operator_delete(local_208.asset_path_._M_dataplus._M_p,
                        CONCAT71(local_208.asset_path_.field_2._M_allocated_capacity._1_7_,
                                 local_208.asset_path_.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar5) {
        return false;
      }
    }
    bVar5 = SkipWhitespace(this);
    if (bVar5) {
      pSVar4 = this->_sr;
      uVar7 = pSVar4->idx_ + 1;
      if (uVar7 <= pSVar4->length_) {
        uVar3 = pSVar4->binary_[pSVar4->idx_];
        pSVar4->idx_ = uVar7;
        uVar7 = pSVar4->idx_ - 1;
        bVar5 = uVar7 <= pSVar4->length_;
        if (uVar3 == '<') {
          if (bVar5 && -1 < (long)uVar7) {
            pSVar4->idx_ = uVar7;
            paVar1 = &local_208.asset_path_.field_2;
            local_208.asset_path_._M_string_length = 0;
            local_208.asset_path_.field_2._M_local_buf[0] = '\0';
            local_208.asset_path_._M_dataplus._M_p = (pointer)paVar1;
            bVar5 = ReadPathIdentifier(this,(string *)&local_208);
            if (bVar5) {
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
              Path::Path((Path *)local_1a8,(string *)&local_208,&local_1c8);
              Path::operator=(&out->prim_path,(Path *)local_1a8);
              Path::~Path((Path *)local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
                operator_delete(local_1c8._M_dataplus._M_p,
                                local_1c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208.asset_path_._M_dataplus._M_p == paVar1) {
                return true;
              }
              operator_delete(local_208.asset_path_._M_dataplus._M_p,
                              CONCAT71(local_208.asset_path_.field_2._M_allocated_capacity._1_7_,
                                       local_208.asset_path_.field_2._M_local_buf[0]) + 1);
              return true;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.asset_path_._M_dataplus._M_p != paVar1) {
              operator_delete(local_208.asset_path_._M_dataplus._M_p,
                              CONCAT71(local_208.asset_path_.field_2._M_allocated_capacity._1_7_,
                                       local_208.asset_path_.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        else if (bVar5 && -1 < (long)uVar7) {
          pSVar4->idx_ = uVar7;
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseReference(Reference *out, bool *triple_deliminated) {
  /*
    Asset reference = AsssetIdentifier + optially followd by prim path

    AssetIdentifier could be empty(self-reference?)

    Example:
     "bora"
     @bora@
     @bora@</dora>
     </bora>
  */

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  // Parse AssetIdentifier
  {
    char nc;
    if (!LookChar1(&nc)) {
      return false;
    }

    if (nc == '<') {
      // No Asset Identifier.
      out->asset_path = value::AssetPath("");
    } else {
      value::AssetPath ap;
      if (!ParseAssetIdentifier(&ap, triple_deliminated)) {
        PUSH_ERROR_AND_RETURN_TAG(kAscii,
                                  "Failed to parse asset path identifier.");
      }
      out->asset_path = ap;
    }
  }

  // Parse optional prim_path
  if (!SkipWhitespace()) {
    return false;
  }

  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '<') {
      if (!Rewind(1)) {
        return false;
      }

      std::string path;
      if (!ReadPathIdentifier(&path)) {
        return false;
      }

      out->prim_path = Path(path, "");
    } else {
      if (!Rewind(1)) {
        return false;
      }
    }
  }

  // TODO: LayerOffset and CustomData

  return true;
}